

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_maximum_work_group_sizes
               (NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  char *pcVar1;
  bool bVar2;
  ContextType ctxType;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  GLint maxWorkGroupSizeZ;
  GLint maxWorkGroupSizeY;
  GLint maxWorkGroupSizeX;
  ComputeSource compSource;
  GLint maxWorkGroupInvocations;
  ShaderProgram program;
  ostringstream compShaderSource;
  undefined1 auStack_448 [12];
  GLint local_43c;
  GLint local_438;
  GLint local_434;
  uint local_430;
  value_type local_428;
  char *local_408;
  GLint local_3fc;
  undefined1 local_3f8 [16];
  TestLog local_3e8 [13];
  ios_base local_380 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_368;
  undefined1 local_348 [208];
  ShaderProgram local_278;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91bf,0,&local_434);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91bf,1,&local_438);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetIntegeri_v(&ctx->super_CallLogWrapper,0x91bf,2,&local_43c);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x90eb,&local_3fc);
  NegativeTestContext::expectError(ctx,0);
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_408 = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  if ((anonymous_namespace)::
      invalid_maximum_work_group_sizes(deqp::gles31::Functional::NegativeTestShared::NegativeTestContext&)
      ::localWorkGroupSizeCases == '\0') {
    _GLOBAL__N_1::invalid_maximum_work_group_sizes();
  }
  this = (ostringstream *)(local_3f8 + 8);
  lVar5 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar1 = local_408;
    if (local_408 == (char *)0x0) {
      std::ios::clear((int)auStack_448 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x2a0);
    }
    else {
      sVar3 = strlen(local_408);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar1,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(local_size_x = ",0x16);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (local_1a8,invalid_maximum_work_group_sizes::localWorkGroupSizeCases[lVar5].x
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_y = ",0x11);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,invalid_maximum_work_group_sizes::localWorkGroupSizeCases[lVar5].y);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", local_size_z = ",0x11);
    poVar4 = (ostream *)
             std::ostream::operator<<
                       (poVar4,invalid_maximum_work_group_sizes::localWorkGroupSizeCases[lVar5].z);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,") in;\n",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"void main (void)\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    std::__cxx11::stringbuf::str();
    local_430 = 5;
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_428,local_3f8._0_8_,
               (long)(qpTestLog **)local_3f8._0_8_ + local_3f8._8_8_);
    if ((TestLog *)local_3f8._0_8_ != local_3e8) {
      operator_delete((void *)local_3f8._0_8_,(ulong)((long)&(local_3e8[0].m_log)->flags + 1));
    }
    renderCtx = ctx->m_renderCtx;
    local_348[0x10] = 0;
    local_348._17_8_ = 0;
    local_348._0_8_ = (pointer)0x0;
    local_348[8] = 0;
    local_348._9_7_ = 0;
    memset((MessageBuilder *)local_3f8,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3f8 + (ulong)local_430 * 0x18),&local_428);
    glu::ShaderProgram::ShaderProgram(&local_278,renderCtx,(ProgramSources *)local_3f8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_368);
    lVar6 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_3f8 + lVar6));
      lVar6 = lVar6 + -0x18;
    } while (lVar6 != -0x18);
    local_3f8._0_8_ = local_3e8;
    if (lVar5 == 3) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3f8,
                 "A compile time or link error is generated if the maximum number of invocations in a single local work group (product of the three dimensions) is greater than GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS."
                 ,"");
      NegativeTestContext::beginSection(ctx,(string *)local_3f8);
      if ((TestLog *)local_3f8._0_8_ != local_3e8) {
        operator_delete((void *)local_3f8._0_8_,(ulong)((long)&(local_3e8[0].m_log)->flags + 1));
      }
      glu::operator<<((ctx->super_CallLogWrapper).m_log,&local_278);
      if ((local_278.m_program.m_info.linkOk == true) &&
         (((*local_278.m_shaders[5].
             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
             super__Vector_impl_data._M_start)->m_info).compileOk == true)) {
        local_3f8._0_8_ = (ctx->super_CallLogWrapper).m_log;
        std::__cxx11::ostringstream::ostringstream(this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Program was not expected to compile or link.",0x2c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_3f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this);
        std::ios_base::~ios_base(local_380);
        local_3f8._0_8_ = local_3e8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3f8,"Program was not expected to compile or link.","");
        NegativeTestContext::fail(ctx,(string *)local_3f8);
        if ((TestLog *)local_3f8._0_8_ != local_3e8) {
          operator_delete((void *)local_3f8._0_8_,(ulong)((long)&(local_3e8[0].m_log)->flags + 1));
        }
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3f8,
                 "A compile time error is generated if the fixed local group size of the shader in any dimension is greater than the maximum supported."
                 ,"");
      NegativeTestContext::beginSection(ctx,(string *)local_3f8);
      if ((TestLog *)local_3f8._0_8_ != local_3e8) {
        operator_delete((void *)local_3f8._0_8_,(ulong)((long)&(local_3e8[0].m_log)->flags + 1));
      }
      verifyCompileError(ctx,&local_278,SHADERTYPE_COMPUTE);
    }
    NegativeTestContext::endSection(ctx);
    glu::ShaderProgram::~ShaderProgram(&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void invalid_maximum_work_group_sizes (NegativeTestContext& ctx)
{
	GLint maxWorkGroupSizeX;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)0, &maxWorkGroupSizeX);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupSizeY;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)1, &maxWorkGroupSizeY);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupSizeZ;
	ctx.glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_SIZE, (GLuint)2, &maxWorkGroupSizeZ);
	ctx.expectError(GL_NO_ERROR);

	GLint maxWorkGroupInvocations;
	ctx.glGetIntegerv(GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS, &maxWorkGroupInvocations);
	ctx.expectError(GL_NO_ERROR);

	DE_ASSERT((maxWorkGroupSizeX * maxWorkGroupSizeY * maxWorkGroupSizeZ) > maxWorkGroupInvocations );

	const bool				isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const char* const		shaderVersion	= isES32
											? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES)
											: getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);

	static const struct
	{
		GLint x;
		GLint y;
		GLint z;
	} localWorkGroupSizeCases[] =
	{
		{	maxWorkGroupSizeX+1,	1,						1						},
		{	1,						maxWorkGroupSizeY+1,	1						},
		{	1,						1,						maxWorkGroupSizeZ+1		},
		{	maxWorkGroupSizeX,		maxWorkGroupSizeY,		maxWorkGroupSizeZ		},
	};

	for (int testCase = 0; testCase < DE_LENGTH_OF_ARRAY(localWorkGroupSizeCases); ++testCase)
	{
		std::ostringstream compShaderSource;

		compShaderSource	<<	shaderVersion << "\n"
							<<	"layout(local_size_x = " << localWorkGroupSizeCases[testCase].x << ", local_size_y = " << localWorkGroupSizeCases[testCase].y << ", local_size_z = " << localWorkGroupSizeCases[testCase].z << ") in;\n"
							<<	"void main (void)\n"
							<<	"{\n"
							<<	"}\n";

		const glu::ComputeSource	compSource(compShaderSource.str());
		glu::ShaderProgram			program(ctx.getRenderContext(), glu::ProgramSources() << compSource);

		if (testCase == DE_LENGTH_OF_ARRAY(localWorkGroupSizeCases)-1)
		{
			bool testFailed = false;
			ctx.beginSection("A compile time or link error is generated if the maximum number of invocations in a single local work group (product of the three dimensions) is greater than GL_MAX_COMPUTE_WORK_GROUP_INVOCATIONS.");

			ctx.getLog() << program;
			testFailed = (program.getProgramInfo().linkOk) && (program.getShaderInfo(glu::SHADERTYPE_COMPUTE).compileOk);

			if (testFailed)
			{
				const char* const message("Program was not expected to compile or link.");
				ctx.getLog() << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;
				ctx.fail(message);
			}
		}
		else
		{
			ctx.beginSection("A compile time error is generated if the fixed local group size of the shader in any dimension is greater than the maximum supported.");
			verifyCompileError(ctx, program, glu::SHADERTYPE_COMPUTE);
		}

		ctx.endSection();
	}
}